

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O0

bool __thiscall iqnet::ssl::Reaction_connection::reg_shutdown(Reaction_connection *this)

{
  bool bVar1;
  Reaction_connection *this_local;
  
  this->state = SHUTDOWN;
  bVar1 = Connection::shutdown_sent(&this->super_Connection);
  if (bVar1) {
    bVar1 = Connection::shutdown_recved(&this->super_Connection);
    if (bVar1) {
      this->state = EMPTY;
      return true;
    }
    (*this->reactor->_vptr_Reactor_base[2])(this->reactor,this,1);
  }
  else {
    (*this->reactor->_vptr_Reactor_base[2])(this->reactor,this,2);
  }
  return false;
}

Assistant:

bool ssl::Reaction_connection::reg_shutdown()
{
  state = SHUTDOWN;

  if( !shutdown_sent() )
  {
    reactor->register_handler( this, Reactor_base::OUTPUT );
  }
  else if( !shutdown_recved() )
  {
    reactor->register_handler( this, Reactor_base::INPUT );
  }
  else
  {
    state = EMPTY;
    return true;
  }

  return false;
}